

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

bool tinyusdz::CastToXformable(Prim *prim,Xformable **xformable)

{
  GeomMesh *pGVar1;
  bool bVar2;
  Value *this;
  
  if (xformable == (Xformable **)0x0) {
    bVar2 = false;
  }
  else {
    this = &prim->_data;
    pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::GPrim>(this,false);
    if ((((((((pGVar1 == (GeomMesh *)0x0) &&
             (pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::Xform>(this,false),
             pGVar1 == (GeomMesh *)0x0)) &&
            (pGVar1 = value::Value::as<tinyusdz::GeomMesh>(this,false), pGVar1 == (GeomMesh *)0x0))
           && (((pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::GeomBasisCurves>(this,false),
                pGVar1 == (GeomMesh *)0x0 &&
                (pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::GeomCube>(this,false),
                pGVar1 == (GeomMesh *)0x0)) &&
               ((pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::GeomSphere>(this,false),
                pGVar1 == (GeomMesh *)0x0 &&
                ((pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::GeomCylinder>(this,false),
                 pGVar1 == (GeomMesh *)0x0 &&
                 (pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::GeomCone>(this,false),
                 pGVar1 == (GeomMesh *)0x0)))))))) &&
          (pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::GeomCapsule>(this,false),
          pGVar1 == (GeomMesh *)0x0)) &&
         (((((pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::GeomPoints>(this,false),
             pGVar1 == (GeomMesh *)0x0 &&
             (pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::GeomCamera>(this,false),
             pGVar1 == (GeomMesh *)0x0)) &&
            (pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::SkelRoot>(this,false),
            pGVar1 == (GeomMesh *)0x0)) &&
           ((pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::Skeleton>(this,false),
            pGVar1 == (GeomMesh *)0x0 &&
            (pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::RectLight>(this,false),
            pGVar1 == (GeomMesh *)0x0)))) &&
          ((pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::DomeLight>(this,false),
           pGVar1 == (GeomMesh *)0x0 &&
           ((pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::CylinderLight>(this,false),
            pGVar1 == (GeomMesh *)0x0 &&
            (pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::SphereLight>(this,false),
            pGVar1 == (GeomMesh *)0x0)))))))) &&
        ((pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::DiskLight>(this,false),
         pGVar1 == (GeomMesh *)0x0 &&
         (((pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::DistantLight>(this,false),
           pGVar1 == (GeomMesh *)0x0 &&
           (pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::RectLight>(this,false),
           pGVar1 == (GeomMesh *)0x0)) &&
          (pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::GeometryLight>(this,false),
          pGVar1 == (GeomMesh *)0x0)))))) &&
       (((pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::PortalLight>(this,false),
         pGVar1 == (GeomMesh *)0x0 &&
         (pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::PluginLight>(this,false),
         pGVar1 == (GeomMesh *)0x0)) &&
        ((pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::SkelRoot>(this,false),
         pGVar1 == (GeomMesh *)0x0 &&
         (pGVar1 = (GeomMesh *)value::Value::as<tinyusdz::Skeleton>(this,false),
         pGVar1 == (GeomMesh *)0x0)))))) {
      return false;
    }
    *xformable = (Xformable *)pGVar1;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool CastToXformable(const Prim &prim, const Xformable **xformable) {
  if (!xformable) {
    return false;
  }

  // __ty = class derived from Xformable.
#define TRY_CAST(__ty)             \
  if (auto pv = prim.as<__ty>()) { \
    (*xformable) = pv;             \
    return true;                   \
  }

  // TODO: Use tydra::ApplyToXformable
  TRY_CAST(GPrim)
  TRY_CAST(Xform)
  TRY_CAST(GeomMesh)
  TRY_CAST(GeomBasisCurves)
  TRY_CAST(GeomCube)
  TRY_CAST(GeomSphere)
  TRY_CAST(GeomCylinder)
  TRY_CAST(GeomCone)
  TRY_CAST(GeomCapsule)
  TRY_CAST(GeomPoints)
  // TRY_CAST(GeomPointInstancer)
  TRY_CAST(GeomCamera)
  TRY_CAST(SkelRoot)
  TRY_CAST(Skeleton)
  TRY_CAST(RectLight)
  TRY_CAST(DomeLight)
  TRY_CAST(CylinderLight)
  TRY_CAST(SphereLight)
  TRY_CAST(DiskLight)
  TRY_CAST(DistantLight)
  TRY_CAST(RectLight)
  TRY_CAST(GeometryLight)
  TRY_CAST(PortalLight)
  TRY_CAST(PluginLight)
  TRY_CAST(SkelRoot)
  TRY_CAST(Skeleton)

  return false;
}